

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGtR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  uint32_t uVar1;
  TcParseTableBase *table_00;
  bool bVar2;
  uint uVar3;
  TcParseTableBase *field;
  MessageLite *pMVar4;
  ulong uVar5;
  Nonnull<const_char_*> failure_msg;
  char *pcVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  MessageLite *unaff_RBX;
  int iVar8;
  TcParseTableBase *ptr_00;
  uint *puVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int iVar12;
  long v1_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  LogMessageFatal local_78;
  uint64_t local_68;
  MessageLite *local_60;
  ClassData *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  field = (TcParseTableBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  uVar10 = (uint32_t)(byte)*ptr;
  aVar7.data = (ulong)data.field_0 >> 0x18 & 0xff;
  table_00 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset + aVar7.data * 8 + (ulong)table->aux_offset);
  uVar11 = (uint32_t)(byte)*ptr;
  local_68 = hasbits;
  local_60 = msg;
  local_58 = (ClassData *)table;
  do {
    ptr_00 = field;
    pMVar4 = AddMessage(table_00,(RepeatedPtrFieldBase *)field);
    auVar13._8_8_ = extraout_RDX;
    auVar13._0_8_ = local_78.super_LogMessage._0_8_;
    iVar12 = ctx->depth_;
    v1 = (long)iVar12 + -1;
    iVar8 = (int)v1;
    ctx->depth_ = iVar8;
    if ((long)iVar12 < 1) {
      ptr = (char *)0x0;
    }
    else {
      v1_00 = (long)ctx->group_depth_ + 1;
      iVar12 = (int)v1_00;
      ctx->group_depth_ = iVar12;
      local_78.super_LogMessage._0_8_ =
           (TcParseTableBase *)((long)&((TcParseTableBase *)ptr)->has_bits_offset + 1);
      uVar10 = uVar11;
      while( true ) {
        ptr_00 = (TcParseTableBase *)&local_78;
        bVar2 = EpsCopyInputStream::DoneWithCheck<false>
                          (&ctx->super_EpsCopyInputStream,(char **)&local_78,ctx->group_depth_);
        auVar13._8_8_ = extraout_RDX_00;
        auVar13._0_8_ = local_78.super_LogMessage._0_8_;
        if (bVar2) break;
        uVar3 = (uint)table_00->fast_idx_mask & (uint)*(uint16_t *)local_78.super_LogMessage._0_8_;
        if ((uVar3 & 7) != 0) goto LAB_00444fca;
        uVar5 = (ulong)(uVar3 & 0xfffffff8);
        aVar7.data = (ulong)*(uint16_t *)local_78.super_LogMessage._0_8_ ^
                     *(ulong *)(&table_00[1].fast_idx_mask + uVar5 * 2);
        auVar13 = (**(code **)(&table_00[1].has_bits_offset + uVar5))
                            (pMVar4,local_78.super_LogMessage._0_8_,ctx,aVar7.data,table_00,0);
        ptr_00 = (TcParseTableBase *)local_78.super_LogMessage._0_8_;
        if ((auVar13._0_8_ == (TcParseTableBase *)0x0) ||
           (local_78.super_LogMessage._0_8_ = auVar13._0_8_,
           (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      local_78.super_LogMessage._0_8_ = auVar13._0_8_;
      if ((table_00->field_0x9 & 1) == 0) {
        ptr = (char *)local_78.super_LogMessage._0_8_;
        if ((TcParseTableBase *)local_78.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) {
          ptr_00 = table_00;
          VerifyHasBitConsistency
                    (unaff_RBX,(TcParseTableBase *)CONCAT44(uVar10,in_stack_ffffffffffffffb0));
          auVar13._8_8_ = extraout_RDX_01;
          auVar13._0_8_ = local_78.super_LogMessage._0_8_;
          ptr = (char *)local_78.super_LogMessage._0_8_;
        }
      }
      else {
        ptr_00 = (TcParseTableBase *)local_78.super_LogMessage._0_8_;
        auVar14 = (undefined1  [16])
                  (*table_00->post_loop_handler)(pMVar4,(char *)local_78.super_LogMessage._0_8_,ctx)
        ;
        auVar13._8_8_ = auVar14._8_8_;
        auVar13._0_8_ = local_78.super_LogMessage._0_8_;
        ptr = (char *)auVar14._0_8_;
      }
      local_78.super_LogMessage._0_8_ = auVar13._0_8_;
      if ((TcParseTableBase *)ptr != (TcParseTableBase *)0x0) {
        if (iVar8 == ctx->depth_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1,(long)ctx->depth_,"old_depth == depth_");
          auVar13._8_8_ = extraout_RDX_02;
          auVar13._0_8_ = local_78.super_LogMessage._0_8_;
        }
        local_78.super_LogMessage._0_8_ = auVar13._0_8_;
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          iVar12 = 0x491;
LAB_00445008:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,iVar12,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_78);
        }
        ptr_00 = (TcParseTableBase *)(long)ctx->group_depth_;
        if (iVar12 == ctx->group_depth_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
          auVar13._8_8_ = extraout_RDX_03;
          auVar13._0_8_ = local_78.super_LogMessage._0_8_;
        }
        local_78.super_LogMessage._0_8_ = auVar13._0_8_;
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          iVar12 = 0x492;
          goto LAB_00445008;
        }
      }
      ctx->group_depth_ = ctx->group_depth_ + -1;
      ctx->depth_ = ctx->depth_ + 1;
      uVar1 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      uVar11 = uVar10;
      if (uVar1 != uVar10) {
        ptr = (char *)0x0;
      }
    }
    local_78.super_LogMessage._0_8_ = auVar13._0_8_;
    if ((TcParseTableBase *)ptr == (TcParseTableBase *)0x0) {
      pcVar6 = Error(local_60,(char *)ptr_00,auVar13._8_8_,(TcFieldData)aVar7,
                     (TcParseTableBase *)local_58,local_68);
      return pcVar6;
    }
    if ((TcParseTableBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)*(ushort *)&local_58->prototype != 0) {
        puVar9 = (uint *)((long)&local_60->_vptr_MessageLite +
                         (ulong)*(ushort *)&local_58->prototype);
        if (((ulong)puVar9 & 3) != 0) {
          AlignFail();
        }
        *puVar9 = *puVar9 | (uint)local_68;
      }
      return (char *)(TcParseTableBase *)ptr;
    }
    if ((char)((TcParseTableBase *)ptr)->has_bits_offset != (char)uVar10) {
      uVar3 = (uint)*(byte *)&local_58->tc_table & (uint)((TcParseTableBase *)ptr)->has_bits_offset;
      if ((uVar3 & 7) == 0) {
        uVar5 = (ulong)(uVar3 & 0xfffffff8);
        pcVar6 = (char *)(**(code **)((long)&local_58->cached_size_offset + uVar5 * 2))
                                   (local_60,ptr,ctx,
                                    (ulong)((TcParseTableBase *)ptr)->has_bits_offset ^
                                    *(ulong *)((long)&local_58[1].prototype + uVar5 * 2),local_58,
                                    local_68);
        return pcVar6;
      }
LAB_00444fca:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}